

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexClose(Fts5Index *p)

{
  sqlite3_stmt *in_RDI;
  int rc;
  
  if (in_RDI != (sqlite3_stmt *)0x0) {
    fts5StructureInvalidate((Fts5Index *)0x269057);
    sqlite3_finalize(in_RDI);
    sqlite3_finalize(in_RDI);
    sqlite3_finalize(in_RDI);
    sqlite3_finalize(in_RDI);
    sqlite3_finalize(in_RDI);
    sqlite3_finalize(in_RDI);
    sqlite3_finalize(in_RDI);
    sqlite3_finalize(in_RDI);
    sqlite3Fts5HashFree((Fts5Hash *)0x2690db);
    sqlite3_free((void *)0x2690e9);
    sqlite3_free((void *)0x2690f3);
  }
  return 0;
}

Assistant:

static int sqlite3Fts5IndexClose(Fts5Index *p){
  int rc = SQLITE_OK;
  if( p ){
    assert( p->pReader==0 );
    fts5StructureInvalidate(p);
    sqlite3_finalize(p->pWriter);
    sqlite3_finalize(p->pDeleter);
    sqlite3_finalize(p->pIdxWriter);
    sqlite3_finalize(p->pIdxDeleter);
    sqlite3_finalize(p->pIdxSelect);
    sqlite3_finalize(p->pIdxNextSelect);
    sqlite3_finalize(p->pDataVersion);
    sqlite3_finalize(p->pDeleteFromIdx);
    sqlite3Fts5HashFree(p->pHash);
    sqlite3_free(p->zDataTbl);
    sqlite3_free(p);
  }
  return rc;
}